

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<char>::addAll<char*,true>(ArrayBuilder<char> *this,char *start,char *end)

{
  char *pcVar1;
  char *end_local;
  char *start_local;
  ArrayBuilder<char> *this_local;
  
  pcVar1 = _::CopyConstructArray_<char,_char_*,_true,_false>::apply(this->pos,start,end);
  this->pos = pcVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}